

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendPositionIndependentLinkerFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *config,
          string *lang)

{
  size_type sVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  _Alloc_hider _Var6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flagsList;
  string pieFlags;
  string name;
  string supported;
  string mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == EXECUTABLE) {
    pcVar4 = cmGeneratorTarget::GetLinkPIEProperty(target,config);
    if (pcVar4 != (char *)0x0) {
      bVar2 = cmSystemTools::IsOn(pcVar4);
      pcVar4 = "NO_PIE";
      if (bVar2) {
        pcVar4 = "PIE";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,pcVar4,(allocator<char> *)&local_68);
      std::operator+(&local_c8,"CMAKE_",lang);
      std::operator+(&local_a8,&local_c8,"_LINK_");
      std::operator+(&local_88,&local_a8,&local_48);
      std::operator+(&local_68,&local_88,"_SUPPORTED");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      pcVar4 = cmMakefile::GetDefinition(this->Makefile,&local_68);
      bVar2 = cmSystemTools::IsOff(pcVar4);
      if (!bVar2) {
        std::operator+(&local_c8,"CMAKE_",lang);
        std::operator+(&local_a8,&local_c8,"_LINK_OPTIONS_");
        std::operator+(&local_88,&local_a8,&local_48);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,&local_88);
        std::__cxx11::string::string((string *)&local_a8,(string *)psVar5);
        if (local_a8._M_string_length != 0) {
          local_c8._M_dataplus._M_p = (pointer)0x0;
          local_c8._M_string_length = 0;
          local_c8.field_2._M_allocated_capacity = 0;
          cmSystemTools::ExpandListArgument
                    (&local_a8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_c8,false);
          sVar1 = local_c8._M_string_length;
          for (_Var6._M_p = local_c8._M_dataplus._M_p; _Var6._M_p != (pointer)sVar1;
              _Var6._M_p = _Var6._M_p + 0x20) {
            (*this->_vptr_cmLocalGenerator[8])(this,flags,_Var6._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_c8);
        }
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendPositionIndependentLinkerFlags(
  std::string& flags, cmGeneratorTarget* target, const std::string& config,
  const std::string& lang)
{
  // For now, only EXECUTABLE is concerned
  if (target->GetType() != cmStateEnums::EXECUTABLE) {
    return;
  }

  const char* PICValue = target->GetLinkPIEProperty(config);
  if (PICValue == nullptr) {
    // POSITION_INDEPENDENT_CODE is not set
    return;
  }

  const std::string mode = cmSystemTools::IsOn(PICValue) ? "PIE" : "NO_PIE";

  std::string supported = "CMAKE_" + lang + "_LINK_" + mode + "_SUPPORTED";
  if (cmSystemTools::IsOff(this->Makefile->GetDefinition(supported))) {
    return;
  }

  std::string name = "CMAKE_" + lang + "_LINK_OPTIONS_" + mode;

  auto pieFlags = this->Makefile->GetSafeDefinition(name);
  if (pieFlags.empty()) {
    return;
  }

  std::vector<std::string> flagsList;
  cmSystemTools::ExpandListArgument(pieFlags, flagsList);
  for (const auto& flag : flagsList) {
    this->AppendFlagEscape(flags, flag);
  }
}